

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform_constraint.cpp
# Opt level: O2

unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>,_true> __thiscall
duckdb::Transformer::TransformConstraint
          (Transformer *this,PGConstraint *constraint,ColumnDefinition *column,idx_t index)

{
  bool bVar1;
  CompressionType compression_type;
  CompressionType *pCVar2;
  optional_ptr<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
  override_fk_column;
  InvalidInputException *pIVar3;
  string *psVar4;
  ParserException *this_00;
  NotImplementedException *this_01;
  bool local_89;
  LogicalIndex local_88;
  string local_80;
  undefined1 local_60 [16];
  LogicalIndex local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  switch(*(undefined4 *)((long)&(column->name)._M_dataplus._M_p + 4)) {
  case 0:
    goto switchD_0134d1f9_caseD_0;
  case 1:
    make_uniq<duckdb::NotNullConstraint,duckdb::LogicalIndex>((duckdb *)&local_80,&local_88);
    goto LAB_0134d375;
  case 2:
    TransformExpression((Transformer *)local_60,
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)constraint);
    ColumnDefinition::SetDefaultValue
              ((ColumnDefinition *)index,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)local_60);
    local_60._8_8_ = local_60._0_8_;
    break;
  default:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_80,"Constraint not implemented!",(allocator *)&local_88);
    NotImplementedException::NotImplementedException(this_01,(string *)&local_80);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  case 4:
    TransformConstraint(this,constraint);
    return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
           (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
  case 5:
    ColumnDefinition::GetName_abi_cxx11_(&local_80,(ColumnDefinition *)index);
    local_89 = true;
    make_uniq<duckdb::UniqueConstraint,duckdb::LogicalIndex,std::__cxx11::string,bool>
              ((duckdb *)&local_88,&local_50,&local_80,&local_89);
    goto LAB_0134d2b0;
  case 6:
    ColumnDefinition::GetName_abi_cxx11_(&local_80,(ColumnDefinition *)index);
    local_89 = false;
    make_uniq<duckdb::UniqueConstraint,duckdb::LogicalIndex,std::__cxx11::string,bool>
              ((duckdb *)&local_88,&local_50,&local_80,&local_89);
LAB_0134d2b0:
    (this->parent).ptr = (Transformer *)local_88.index;
    local_88.index = 0;
    ::std::__cxx11::string::~string((string *)&local_80);
    return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
           (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
  case 8:
    override_fk_column.ptr = ColumnDefinition::Name_abi_cxx11_((ColumnDefinition *)index);
    TransformForeignKeyConstraint((duckdb *)&local_80,(PGConstraint *)column,override_fk_column);
LAB_0134d375:
    (this->parent).ptr = (Transformer *)local_80._M_dataplus._M_p;
    return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
           (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
  case 0xd:
    ::std::__cxx11::string::string
              ((string *)&local_80,(char *)(column->tags)._M_h._M_buckets,(allocator *)&local_88);
    compression_type = CompressionTypeFromString(&local_80);
    ColumnDefinition::SetCompressionType((ColumnDefinition *)index,compression_type);
    ::std::__cxx11::string::~string((string *)&local_80);
    pCVar2 = ColumnDefinition::CompressionType((ColumnDefinition *)index);
    if (*pCVar2 == COMPRESSION_AUTO) {
      this_00 = (ParserException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_80,
                 "Unrecognized option for column compression, expected none, uncompressed, rle, dictionary, pfor, bitpacking or fsst"
                 ,(allocator *)&local_88);
      ParserException::ParserException(this_00,&local_80);
      __cxa_throw(this_00,&ParserException::typeinfo,::std::runtime_error::~runtime_error);
    }
    goto switchD_0134d1f9_caseD_0;
  case 0xe:
    bVar1 = ColumnDefinition::HasDefaultValue((ColumnDefinition *)index);
    if (bVar1) {
      pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_80,
                 "\"%s\" has a DEFAULT value set, it can not become a GENERATED column",
                 (allocator *)&local_88);
      psVar4 = ColumnDefinition::Name_abi_cxx11_((ColumnDefinition *)index);
      ::std::__cxx11::string::string((string *)&local_48,(string *)psVar4);
      InvalidInputException::InvalidInputException<std::__cxx11::string>(pIVar3,&local_80,&local_48)
      ;
      __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    TransformExpression((Transformer *)(local_60 + 8),
                        (optional_ptr<duckdb_libpgquery::PGNode,_true>)constraint);
    ColumnDefinition::SetGeneratedExpression
              ((ColumnDefinition *)index,
               (unique_ptr<duckdb::ParsedExpression,_std::default_delete<duckdb::ParsedExpression>,_true>
                *)(local_60 + 8));
    break;
  case 0xf:
    pIVar3 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string
              ((string *)&local_80,"Can not create a STORED generated column!",
               (allocator *)&local_88);
    InvalidInputException::InvalidInputException(pIVar3,(string *)&local_80);
    __cxa_throw(pIVar3,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((Transformer *)local_60._8_8_ != (Transformer *)0x0) {
    (*(code *)((((Transformer *)local_60._8_8_)->parent).ptr)->options)();
  }
switchD_0134d1f9_caseD_0:
  (this->parent).ptr = (Transformer *)0x0;
  return (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)
         (unique_ptr<duckdb::Constraint,_std::default_delete<duckdb::Constraint>_>)this;
}

Assistant:

unique_ptr<Constraint> Transformer::TransformConstraint(duckdb_libpgquery::PGConstraint &constraint,
                                                        ColumnDefinition &column, idx_t index) {
	switch (constraint.contype) {
	case duckdb_libpgquery::PG_CONSTR_NOTNULL:
		return make_uniq<NotNullConstraint>(LogicalIndex(index));
	case duckdb_libpgquery::PG_CONSTR_CHECK:
		return TransformConstraint(constraint);
	case duckdb_libpgquery::PG_CONSTR_PRIMARY:
		return make_uniq<UniqueConstraint>(LogicalIndex(index), column.GetName(), true);
	case duckdb_libpgquery::PG_CONSTR_UNIQUE:
		return make_uniq<UniqueConstraint>(LogicalIndex(index), column.GetName(), false);
	case duckdb_libpgquery::PG_CONSTR_NULL:
		return nullptr;
	case duckdb_libpgquery::PG_CONSTR_GENERATED_VIRTUAL: {
		if (column.HasDefaultValue()) {
			throw InvalidInputException("\"%s\" has a DEFAULT value set, it can not become a GENERATED column",
			                            column.Name());
		}
		column.SetGeneratedExpression(TransformExpression(constraint.raw_expr));
		return nullptr;
	}
	case duckdb_libpgquery::PG_CONSTR_GENERATED_STORED:
		throw InvalidInputException("Can not create a STORED generated column!");
	case duckdb_libpgquery::PG_CONSTR_DEFAULT:
		column.SetDefaultValue(TransformExpression(constraint.raw_expr));
		return nullptr;
	case duckdb_libpgquery::PG_CONSTR_COMPRESSION:
		column.SetCompressionType(CompressionTypeFromString(constraint.compression_name));
		if (column.CompressionType() == CompressionType::COMPRESSION_AUTO) {
			throw ParserException("Unrecognized option for column compression, expected none, uncompressed, rle, "
			                      "dictionary, pfor, bitpacking or fsst");
		}
		return nullptr;
	case duckdb_libpgquery::PG_CONSTR_FOREIGN:
		return TransformForeignKeyConstraint(constraint, &column.Name());
	default:
		throw NotImplementedException("Constraint not implemented!");
	}
}